

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  ContextWrapper *pCVar1;
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar2;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  int level;
  deUint32 tex;
  int local_dc;
  long local_d8;
  BasicTexImageCubeCase *local_d0;
  Vec4 *local_c8;
  TextureFormatInfo *local_c0;
  ContextWrapper *local_b8;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar2 = deStringHash((this->super_TextureCubeSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  pCVar1 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(pCVar1,1,&tex);
  sglr::ContextWrapper::glBindTexture(pCVar1,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(pCVar1,0xcf5,1);
  minVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  maxVal = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  local_d0 = this;
  local_c8 = maxVal;
  local_c0 = minVal;
  local_b8 = pCVar1;
  for (level = 0; level < (this->super_TextureCubeSpecCase).m_numLevels; level = level + 1) {
    local_dc = (this->super_TextureCubeSpecCase).m_size >> ((byte)level & 0x1f);
    if (local_dc < 2) {
      local_dc = 1;
    }
    tcu::TextureLevel::setSize(&levelData,local_dc,local_dc,1);
    local_d8 = 0;
    while( true ) {
      if (local_d8 == 0x18) break;
      randomVector<4>((Functional *)&gMin,&rnd,&minVal->valueMin,maxVal);
      randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      pCVar1 = local_b8;
      dVar2 = *(deUint32 *)((long)&s_cubeMapFaces + local_d8);
      internalFormat = this->m_internalFormat;
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (pCVar1,dVar2,level,internalFormat,local_dc,local_dc,0,format,type,
                 local_58.super_ConstPixelBufferAccess.m_data);
      local_d8 = local_d8 + 4;
      this = local_d0;
      minVal = local_c0;
      maxVal = local_c8;
    }
    local_d8 = 0x18;
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			levelData.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}